

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_fl_greater(asmcode *code,compiler_options *param_2)

{
  int local_b0 [26];
  unsigned_long local_48;
  operand local_3c [2];
  operation local_34;
  unsigned_long local_30;
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_1c = AND;
  local_24[1] = 9;
  local_24[0] = NUMBER;
  local_30 = 0xfffffffffffffff8;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1c,local_24 + 1,local_24,&local_30);
  local_34 = AND;
  local_3c[1] = 10;
  local_3c[0] = NUMBER;
  local_48 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            ((asmcode *)param_1_local,&local_34,local_3c + 1,local_3c,&local_48);
  local_b0[0x19] = 0x43;
  local_b0[0x18] = 0x43;
  local_b0[0x17] = 0x19;
  local_b0[0x16] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_b0 + 0x19),(operand *)(local_b0 + 0x18),
             (operand *)(local_b0 + 0x17),local_b0 + 0x16);
  local_b0[0x15] = 0x43;
  local_b0[0x14] = 0x44;
  local_b0[0x13] = 0x1a;
  local_b0[0x12] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_b0 + 0x15),(operand *)(local_b0 + 0x14),
             (operand *)(local_b0 + 0x13),local_b0 + 0x12);
  local_b0[0x11] = 7;
  local_b0[0x10] = 0x44;
  local_b0[0xf] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)(local_b0 + 0x11),(operand *)(local_b0 + 0x10),
             (operand *)(local_b0 + 0xf));
  local_b0[0xe] = 0x42;
  local_b0[0xd] = 9;
  local_b0[0xc] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)(local_b0 + 0xe),(operand *)(local_b0 + 0xd),
             (operand *)(local_b0 + 0xc));
  local_b0[0xb] = 2;
  local_b0[10] = 9;
  local_b0[9] = 0x39;
  local_b0[8] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_b0 + 0xb),(operand *)(local_b0 + 10),
             (operand *)(local_b0 + 9),local_b0 + 8);
  local_b0[7] = 0x55;
  local_b0[6] = 9;
  local_b0[5] = 0x39;
  local_b0[4] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_b0 + 7),(operand *)(local_b0 + 6),
             (operand *)(local_b0 + 5),local_b0 + 4);
  local_b0[3] = 0x49;
  local_b0[2] = 9;
  local_b0[1] = 0x39;
  local_b0[0] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_b0 + 3),(operand *)(local_b0 + 2),
             (operand *)(local_b0 + 1),local_b0);
  return;
}

Assistant:

void inline_fl_greater(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::CMPLTPD, ASM::asmcode::XMM1, ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOVMSKPD, ASM::asmcode::RAX, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::SHL, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 3);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_f);
  }